

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  __node_base_ptr *this_00;
  bool bVar1;
  uint32_t id;
  CompilerError *pCVar2;
  ulong uVar3;
  spirv_cross local_918 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8 [8];
  string bitcast_op;
  uint local_8d4;
  spirv_cross local_8d0 [32];
  uint local_8b0;
  uint local_8ac;
  uint32_t r_1;
  uint32_t c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888 [32];
  spirv_cross local_868 [32];
  undefined1 local_848 [8];
  SPIRType scalar_type_1;
  uint local_6d4;
  spirv_cross local_6d0 [36];
  uint local_6ac;
  string local_6a8 [4];
  uint32_t c;
  string local_688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668 [32];
  spirv_cross local_648 [32];
  undefined1 local_628 [8];
  SPIRType vector_type;
  string local_4d0 [32];
  char *local_4b0;
  char *load_op_1;
  spirv_cross local_4a0 [36];
  uint local_47c;
  string local_478 [4];
  uint32_t r;
  string local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  spirv_cross local_3f8 [32];
  undefined1 local_3d8 [8];
  SPIRType scalar_type;
  allocator local_261;
  string local_260 [32];
  char *local_240;
  char *load_op;
  spirv_cross local_218 [32];
  string local_1f8 [8];
  string template_expr;
  string local_1d8 [8];
  string load_expr;
  allocator local_1b1;
  string local_1b0 [5];
  bool templated_load;
  undefined4 local_190;
  undefined1 local_180 [8];
  SPIRType target_type;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  string *expr_local;
  CompilerHLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  SPIRType::SPIRType((SPIRType *)local_180);
  target_type.super_IVariant._vptr_IVariant._4_4_ = 8;
  target_type.super_IVariant._12_4_ =
       *(undefined4 *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
  target_type.width = *(uint32_t *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) == 0xf) {
      read_access_chain_struct(this,lhs,chain);
      local_190 = 1;
    }
    else {
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt != 0x20) &&
         ((this->field_0x2425 & 1) == 0)) {
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b0,
                   "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                   ,&local_1b1);
        CompilerError::CompilerError(pCVar2,(string *)local_1b0);
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = 0x3d < *(uint *)&(this->super_CompilerGLSL).field_0x241c;
      ::std::__cxx11::string::string(local_1d8);
      ::std::__cxx11::string::string(local_1f8);
      if (bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&load_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (local_218,(char (*) [2])0x4dce69,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op,
                   (char (*) [2])0x4e5879);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_218);
        ::std::__cxx11::string::~string((string *)local_218);
        ::std::__cxx11::string::~string((string *)&load_op);
      }
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) &&
         ((chain->row_major_matrix & 1U) == 0)) {
        local_240 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_240 = "Load";
          break;
        case 2:
          local_240 = "Load2";
          break;
        case 3:
          local_240 = "Load3";
          break;
        case 4:
          local_240 = "Load4";
          break;
        default:
          pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_260,"Unknown vector size.",&local_261);
          CompilerError::CompilerError(pCVar2,(string *)local_260);
          __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          local_240 = "Load";
        }
        join<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                  ((spirv_cross *)&scalar_type.member_name_cache._M_h._M_single_bucket,&chain->base,
                   (char (*) [2])0x4dfd16,&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   (char (*) [2])0x4f3f9c,&chain->dynamic_index,&chain->static_index,
                   (char (*) [2])0x4dff7a);
        ::std::__cxx11::string::operator=
                  (local_1d8,(string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
        ::std::__cxx11::string::~string
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
      }
      else if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) {
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_3d8,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.super_IVariant._12_4_ = 1;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_418,this,local_3d8,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_3f8,(char (*) [2])0x4dce69,local_418,(char (*) [2])0x4e5879);
          ::std::__cxx11::string::operator=(local_1f8,(string *)local_3f8);
          ::std::__cxx11::string::~string((string *)local_3f8);
          ::std::__cxx11::string::~string((string *)local_418);
          if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4
                           )) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_458,this,target_type.member_name_cache._M_h._M_single_bucket,0);
            ::std::operator+(local_438,(char *)local_458);
            ::std::__cxx11::string::operator+=(local_1d8,(string *)local_438);
            ::std::__cxx11::string::~string((string *)local_438);
            ::std::__cxx11::string::~string(local_458);
          }
          SPIRType::~SPIRType((SPIRType *)local_3d8);
        }
        else if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt
                              + 4)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_478,this,local_180,0);
          ::std::__cxx11::string::operator=(local_1d8,local_478);
          ::std::__cxx11::string::~string(local_478);
          ::std::__cxx11::string::operator+=(local_1d8,"(");
        }
        for (local_47c = 0;
            local_47c <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
            local_47c = local_47c + 1) {
          load_op_1._4_4_ = chain->static_index + local_47c * chain->matrix_stride;
          join<std::__cxx11::string_const&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (local_4a0,&chain->base,(char (*) [6])".Load",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     (char (*) [2])0x4f3f9c,&chain->dynamic_index,(uint *)((long)&load_op_1 + 4),
                     (char (*) [2])0x4dff7a);
          ::std::__cxx11::string::operator+=(local_1d8,(string *)local_4a0);
          ::std::__cxx11::string::~string((string *)local_4a0);
          if (local_47c + 1 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
            ::std::__cxx11::string::operator+=(local_1d8,", ");
          }
        }
        if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4))
        {
          ::std::__cxx11::string::operator+=(local_1d8,")");
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        local_4b0 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_4b0 = "Load";
          break;
        case 2:
          local_4b0 = "Load2";
          break;
        case 3:
          local_4b0 = "Load3";
          break;
        case 4:
          local_4b0 = "Load4";
          break;
        default:
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
          pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_4d0,"Unknown vector size.",
                     (allocator *)((long)&vector_type.member_name_cache._M_h._M_single_bucket + 7));
          CompilerError::CompilerError(pCVar2,(string *)local_4d0);
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
          __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_628,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_668,this,local_628,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_648,(char (*) [2])0x4dce69,local_668,(char (*) [2])0x4e5879);
          ::std::__cxx11::string::operator=(local_1f8,(string *)local_648);
          ::std::__cxx11::string::~string((string *)local_648);
          ::std::__cxx11::string::~string((string *)local_668);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_688,this,target_type.member_name_cache._M_h._M_single_bucket,0);
          ::std::__cxx11::string::operator=(local_1d8,local_688);
          ::std::__cxx11::string::~string(local_688);
          local_4b0 = "Load";
          SPIRType::~SPIRType((SPIRType *)local_628);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_6a8,this,local_180,0);
          ::std::__cxx11::string::operator=(local_1d8,local_6a8);
          ::std::__cxx11::string::~string(local_6a8);
        }
        ::std::__cxx11::string::operator+=(local_1d8,"(");
        for (local_6ac = 0;
            local_6ac < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_6ac = local_6ac + 1) {
          local_6d4 = chain->static_index + local_6ac * chain->matrix_stride;
          join<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (local_6d0,&chain->base,(char (*) [2])0x4dfd16,&local_4b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     (char (*) [2])0x4f3f9c,&chain->dynamic_index,&local_6d4,(char (*) [2])0x4dff7a)
          ;
          ::std::__cxx11::string::operator+=(local_1d8,(string *)local_6d0);
          ::std::__cxx11::string::~string((string *)local_6d0);
          if (local_6ac + 1 <
              *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            ::std::__cxx11::string::operator+=(local_1d8,", ");
          }
        }
        ::std::__cxx11::string::operator+=(local_1d8,")");
      }
      else {
        if (bVar1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type_1.member_name_cache._M_h._M_single_bucket,this,
                     target_type.member_name_cache._M_h._M_single_bucket,0);
          this_00 = &scalar_type_1.member_name_cache._M_h._M_single_bucket;
          ::std::__cxx11::string::operator=(local_1d8,(string *)this_00);
          ::std::__cxx11::string::~string((string *)this_00);
          SPIRType::SPIRType((SPIRType *)local_848,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.super_IVariant._12_4_ = 1;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_888,this,local_848,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_868,(char (*) [2])0x4dce69,local_888,(char (*) [2])0x4e5879);
          ::std::__cxx11::string::operator=(local_1f8,(string *)local_868);
          ::std::__cxx11::string::~string((string *)local_868);
          ::std::__cxx11::string::~string((string *)local_888);
          SPIRType::~SPIRType((SPIRType *)local_848);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&r_1,this,local_180,0);
          ::std::__cxx11::string::operator=(local_1d8,(string *)&r_1);
          ::std::__cxx11::string::~string((string *)&r_1);
        }
        ::std::__cxx11::string::operator+=(local_1d8,"(");
        for (local_8ac = 0;
            local_8ac < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_8ac = local_8ac + 1) {
          for (local_8b0 = 0;
              local_8b0 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
              local_8b0 = local_8b0 + 1) {
            local_8d4 = chain->static_index +
                        local_8ac *
                        (*(uint *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt >>
                        3) + local_8b0 * chain->matrix_stride;
            join<std::__cxx11::string_const&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      (local_8d0,&chain->base,(char (*) [6])".Load",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,(char (*) [2])0x4f3f9c,&chain->dynamic_index,&local_8d4,
                       (char (*) [2])0x4dff7a);
            ::std::__cxx11::string::operator+=(local_1d8,(string *)local_8d0);
            ::std::__cxx11::string::~string((string *)local_8d0);
            if ((local_8b0 + 1 <
                 *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)
                ) || (local_8ac + 1 <
                      *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt)) {
              ::std::__cxx11::string::operator+=(local_1d8,", ");
            }
          }
        }
        ::std::__cxx11::string::operator+=(local_1d8,")");
      }
      if (!bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])
                  (local_8f8,this,target_type.member_name_cache._M_h._M_single_bucket,local_180);
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (local_918,local_8f8,(char (*) [2])0x4f3f9c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     (char (*) [2])0x4dff7a);
          ::std::__cxx11::string::operator=(local_1d8,(string *)local_918);
          ::std::__cxx11::string::~string((string *)local_918);
        }
        ::std::__cxx11::string::~string((string *)local_8f8);
      }
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,lhs,(char (*) [4])0x4f38c2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   (char (*) [2])0x4d9ce2);
      }
      else {
        if (expr == (string *)0x0) {
          __assert_fail("expr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_hlsl.cpp"
                        ,0xf2a,
                        "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                       );
        }
        ::std::__cxx11::string::operator=((string *)expr,local_1d8);
      }
      ::std::__cxx11::string::~string(local_1f8);
      ::std::__cxx11::string::~string(local_1d8);
      local_190 = 0;
    }
  }
  else {
    read_access_chain_array(this,lhs,chain);
    local_190 = 1;
  }
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(chain.base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(chain.base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(chain.base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(chain.base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}